

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void poison_tick(CHAR_DATA *ch,AFFECT_DATA *af)

{
  bool bVar1;
  long in_RSI;
  undefined8 in_RDI;
  undefined1 in_stack_00001342;
  undefined1 in_stack_00001343;
  int in_stack_00001344;
  int in_stack_00001348;
  int in_stack_0000134c;
  CHAR_DATA *in_stack_00001350;
  CHAR_DATA *in_stack_00001358;
  int in_stack_00001378;
  int in_stack_00001380;
  char *in_stack_00001388;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  
  bVar1 = is_affected_by((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         in_stack_ffffffffffffffd4);
  if (bVar1) {
    act(in_stack_ffffffffffffffe0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
        (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
        (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    send_to_char(in_stack_ffffffffffffffe0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (*(long *)(in_RSI + 8) == 0) {
      *(undefined8 *)(in_RSI + 8) = in_RDI;
    }
    damage_new(in_stack_00001358,in_stack_00001350,in_stack_0000134c,in_stack_00001348,
               in_stack_00001344,(bool)in_stack_00001343,(bool)in_stack_00001342,in_stack_00001378,
               in_stack_00001380,in_stack_00001388);
  }
  return;
}

Assistant:

void poison_tick(CHAR_DATA *ch, AFFECT_DATA *af)
{
	if (!is_affected_by(ch, AFF_POISON))
		return;

	act("$n shivers and suffers.", ch, nullptr, nullptr, TO_ROOM);
	send_to_char("You shiver and suffer.\n\r", ch);

	if (!af->owner)
		af->owner = ch;

	damage_new(af->owner, ch, af->level, gsn_poison, DAM_POISON, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "poison");
}